

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ForLoopStatementSyntax *syntax)

{
  string_view name_00;
  bool bVar1;
  type *ptVar2;
  Scope *scope_00;
  StatementBlockSymbol *syntax_00;
  SyntaxNode *this;
  long in_RSI;
  Scope *in_RDI;
  const_iterator cVar3;
  const_iterator cVar4;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar5;
  VariableSymbol *var;
  SyntaxNode *init;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> *__range2;
  VariableSymbol *lastVar;
  Compilation *comp;
  StatementBlockSymbol *result;
  type *loc;
  type *name;
  SyntaxNode *in_stack_00000568;
  Scope *in_stack_00000570;
  Scope *in_stack_ffffffffffffff10;
  StatementSyntax *local_c0;
  SourceLocation in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff80;
  StatementBlockKind blockKind;
  StatementSyntax *in_stack_ffffffffffffff88;
  Scope *in_stack_ffffffffffffff90;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffff98;
  SourceLocation loc_00;
  size_t sVar6;
  undefined7 uVar7;
  undefined1 labelHandled;
  
  blockKind = (StatementBlockKind)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  parsing::Token::location((Token *)(in_RSI + 0x58));
  getLabel(local_c0,in_stack_ffffffffffffff50);
  ptVar2 = std::get<0ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                       *)0x365924);
  scope_00 = (Scope *)std::
                      get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                                ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                                  *)0x365939);
  sVar6 = ptVar2->_M_len;
  uVar7 = SUB87(ptVar2->_M_str,0);
  labelHandled = (undefined1)((ulong)ptVar2->_M_str >> 0x38);
  loc_00 = (SourceLocation)scope_00->compilation;
  std::optional<slang::ast::VariableLifetime>::optional
            ((optional<slang::ast::VariableLifetime> *)0x36599a);
  name_00._M_str._0_7_ = uVar7;
  name_00._M_len = sVar6;
  name_00._M_str._7_1_ = labelHandled;
  syntax_00 = createBlock(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,name_00,loc_00,
                          blockKind,
                          (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffff98);
  Scope::getCompilation(in_RDI);
  cVar3 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::begin
                    ((SeparatedSyntaxList<slang::syntax::SyntaxNode> *)0x365a14);
  cVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::end
                    ((SeparatedSyntaxList<slang::syntax::SyntaxNode> *)0x365a28);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>_>
                      ((self_type *)in_stack_ffffffffffffff10,
                       (iterator_base<const_slang::syntax::SyntaxNode_*> *)in_stack_ffffffffffffff98
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_false>
           ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_false>
                        *)0x365a56);
    if (this->previewNode != (SyntaxNode *)0x0) {
      Scope::addMembers(in_stack_00000570,in_stack_00000568);
    }
    slang::syntax::SyntaxNode::as<slang::syntax::ForVariableDeclarationSyntax>(this);
    VariableSymbol::fromSyntax
              ((Compilation *)cVar3.list,(ForVariableDeclarationSyntax *)cVar4.index,
               (VariableSymbol *)cVar4.list);
    Scope::addMember(in_stack_ffffffffffffff10,(Symbol *)in_stack_ffffffffffffff98);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::iterator_base<const_slang::syntax::SyntaxNode_*>,_false>
                *)in_stack_ffffffffffffff10);
  }
  not_null<slang::syntax::StatementSyntax_*>::operator*
            ((not_null<slang::syntax::StatementSyntax_*> *)0x365b09);
  sVar5 = Statement::createAndAddBlockItems
                    (scope_00,(StatementSyntax *)syntax_00,(bool)labelHandled);
  local_c0 = (StatementSyntax *)sVar5._M_ptr;
  (syntax_00->blocks)._M_ptr = (pointer)local_c0;
  (syntax_00->blocks)._M_extent._M_extent_value = sVar5._M_extent._M_extent_value._M_extent_value;
  return syntax_00;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ForLoopStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.forKeyword.location());
    auto result = createBlock(scope, syntax, name, loc);

    // If one entry is a variable declaration, they must all be.
    // We'll only enter this function if we have variable decls.
    auto& comp = scope.getCompilation();
    const VariableSymbol* lastVar = nullptr;
    for (auto init : syntax.initializers) {
        if (init->previewNode)
            result->addMembers(*init->previewNode);

        auto& var = VariableSymbol::fromSyntax(comp, init->as<ForVariableDeclarationSyntax>(),
                                               lastVar);

        lastVar = &var;
        result->addMember(var);
    }

    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);
    return *result;
}